

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

bool __thiscall
crnlib::dynamic_string::ensure_buf(dynamic_string *this,uint len,bool preserve_contents)

{
  uint new_buf_size;
  undefined1 in_DL;
  int in_ESI;
  ushort *in_RDI;
  uint buf_size_needed;
  bool in_stack_ffffffffffffffeb;
  undefined3 in_stack_fffffffffffffff0;
  
  new_buf_size = in_ESI + 1;
  if ((new_buf_size < 0x10000) && (*in_RDI < new_buf_size)) {
    expand_buf((dynamic_string *)
               (CONCAT44(in_ESI,CONCAT13(in_DL,in_stack_fffffffffffffff0)) & 0xffffffff01ffffff),
               new_buf_size,in_stack_ffffffffffffffeb);
  }
  return new_buf_size <= *in_RDI;
}

Assistant:

bool dynamic_string::ensure_buf(uint len, bool preserve_contents) {
  uint buf_size_needed = len + 1;

  CRNLIB_ASSERT(buf_size_needed <= cUINT16_MAX);

  if (buf_size_needed <= cUINT16_MAX) {
    if (buf_size_needed > m_buf_size)
      expand_buf(buf_size_needed, preserve_contents);
  }

  return m_buf_size >= buf_size_needed;
}